

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O3

void axiomSelectionMode(Problem *problem)

{
  Unit **ppUVar1;
  Options *opt;
  bool bVar2;
  ostream *poVar3;
  Unit *extraout_RDX;
  Unit *extraout_RDX_00;
  Unit *extraout_RDX_01;
  Unit *unit;
  UnitList *pUVar4;
  ScopedPtr<Kernel::Problem> prb;
  Normalisation norm;
  undefined1 local_98 [16];
  undefined1 local_88 [88];
  
  (Lib::env->_sineSelection).super_OptionValue<Shell::Options::SineSelection>.actualValue = AXIOMS;
  bVar2 = Kernel::Problem::hasFOOL(problem);
  if (bVar2) {
    FOOLElimination::FOOLElimination((FOOLElimination *)local_98);
    FOOLElimination::apply((FOOLElimination *)local_98,problem);
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               (local_88 + 0x10));
  }
  if ((Lib::env->_normalize).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 == '\x01')
  {
    *(undefined4 *)(DAT_00b521c0 + 600) = 3;
    Shell::Normalisation::Normalisation((Normalisation *)local_98);
    Shell::Normalisation::normalise((Normalisation *)local_98,problem);
    Shell::SymCounter::~SymCounter((SymCounter *)local_98);
  }
  opt = Lib::env;
  *(undefined4 *)(DAT_00b521c0 + 600) = 5;
  Shell::SineSelector::SineSelector((SineSelector *)local_98,opt);
  Shell::SineSelector::perform((SineSelector *)local_98,problem);
  Shell::SineSelector::~SineSelector((SineSelector *)local_98);
  *(undefined4 *)(DAT_00b521c0 + 600) = 0x1c;
  pUVar4 = problem->_units;
  if (pUVar4 != (UnitList *)0x0) {
    unit = extraout_RDX;
    do {
      ppUVar1 = &pUVar4->_head;
      pUVar4 = pUVar4->_tail;
      Shell::TPTPPrinter::toString_abi_cxx11_((string *)local_98,(TPTPPrinter *)*ppUVar1,unit);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_98._0_8_,local_98._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      unit = extraout_RDX_00;
      if ((Unit *)local_98._0_8_ != (Unit *)local_88) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
        unit = extraout_RDX_01;
      }
    } while (pUVar4 != (List<Kernel::Unit_*> *)0x0);
  }
  vampireReturnValue = 0;
  Kernel::Problem::~Problem(problem);
  operator_delete(problem,0x110);
  return;
}

Assistant:

void axiomSelectionMode(Problem* problem)
{
  ScopedPtr<Problem> prb(problem);

  env.options->setSineSelection(Options::SineSelection::AXIOMS);

  if (prb->hasFOOL()) {
    FOOLElimination().apply(*prb);
  }

  // reorder units
  if (env.options->normalize()) {
    env.statistics->phase = ExecutionPhase::NORMALIZATION;
    Normalisation norm;
    norm.normalise(*prb);
  }

  env.statistics->phase = ExecutionPhase::SINE_SELECTION;
  Shell::SineSelector(*env.options).perform(*prb);

  env.statistics->phase = ExecutionPhase::FINALIZATION;

  UnitList::Iterator uit(prb->units());
  while (uit.hasNext()) {
    Unit* u = uit.next();
    std::cout << TPTPPrinter::toString(u) << "\n";
  }

  //we have successfully output the selected units, so we'll terminate with zero return value
  vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
}